

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *pcVar1;
  void *pvVar2;
  _func_int *p_Var3;
  _func_int *p_Var4;
  undefined8 uVar5;
  undefined8 uVar6;
  char cVar7;
  ostream *poVar8;
  long lVar9;
  _List_node_base *p_Var10;
  char **ppcVar11;
  long *plVar12;
  int iVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar14;
  int iVar15;
  bool bVar16;
  bool showHelp;
  uint32_t minutes;
  uint64_t permutations;
  uint32_t hours;
  uint64_t start;
  list<std::thread,_std::allocator<std::thread>_> threadList;
  GlobalParams globalParams;
  InternalParseResult result;
  RuntimePtr runtime;
  BufferPtr bytecode;
  Parser parser;
  bool local_699;
  uint local_698;
  int local_694;
  _func_int *local_690;
  uint local_684;
  char **local_680;
  code *local_678;
  undefined8 local_670;
  _func_int *local_668;
  _func_int **local_660;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_658;
  undefined1 local_650 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
  local_640;
  _Alloc_hider local_630;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_620;
  _Alloc_hider local_610;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f0;
  value_type local_5d8;
  string local_5b8;
  long *local_598 [2];
  long local_588 [2];
  value_type local_578;
  value_type local_558;
  string local_538;
  long *local_518 [2];
  long local_508 [2];
  value_type local_4f8;
  value_type local_4d8;
  string local_4b8;
  long *local_498 [2];
  long local_488 [2];
  value_type local_478;
  value_type local_458;
  string local_438;
  _Any_data local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  bool local_3f8;
  bool bStack_3f7;
  undefined2 uStack_3f6;
  undefined4 uStack_3f4;
  undefined1 local_3f0 [24];
  _Alloc_hider _Stack_3d8;
  undefined1 local_3d0 [24];
  undefined1 auStack_3b8 [24];
  _Manager_type local_3a0;
  _Invoker_type p_Stack_398;
  uint32_t local_390;
  bool local_38c;
  _func_int *local_380;
  long *local_378 [2];
  long local_368 [2];
  long *local_358 [2];
  long local_348 [2];
  value_type local_338;
  undefined1 local_318 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2e8;
  _Alloc_hider local_2d8;
  size_type local_2d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b8;
  undefined1 local_2a0 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_288;
  _Alloc_hider local_280;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  _Alloc_hider local_260;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_250;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  undefined1 local_228 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_210;
  _Alloc_hider local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  _Alloc_hider local_1e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  Parser local_1b0;
  Parser local_150;
  Parser local_f0;
  Parser local_90;
  
  local_690 = (_func_int *)0x0;
  local_668 = (_func_int *)0x0;
  local_698 = 0;
  local_684 = 0;
  local_699 = false;
  local_438._M_dataplus._M_p = (pointer)&local_438.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"permutations","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_long>
            ((ParserRefImpl<clara::detail::Opt> *)&local_418,(unsigned_long *)&local_690,&local_438)
  ;
  local_418._M_unused._M_object = &PTR__Opt_00153220;
  auStack_3b8._0_8_ = (pointer)0x0;
  auStack_3b8._8_8_ = (pointer)0x0;
  auStack_3b8._16_8_ = (pointer)0x0;
  local_458._M_dataplus._M_p = (pointer)&local_458.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"-p","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_3b8,&local_458);
  local_478._M_dataplus._M_p = (pointer)&local_478.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_478,"--permutations","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_3b8,&local_478);
  local_498[0] = local_488;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_498,"Max number of permutations to run","");
  std::__cxx11::string::_M_assign((string *)&_Stack_3d8);
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4b8,"start","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_long>
            ((ParserRefImpl<clara::detail::Opt> *)local_318,(unsigned_long *)&local_668,&local_4b8);
  local_318._0_8_ = &PTR__Opt_00153220;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4d8._M_dataplus._M_p = (pointer)&local_4d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4d8,"-s","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_2b8,&local_4d8);
  local_4f8._M_dataplus._M_p = (pointer)&local_4f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_4f8,"--start","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_2b8,&local_4f8);
  local_518[0] = local_508;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_518,"Starting permutation","");
  std::__cxx11::string::_M_assign((string *)&local_2d8);
  clara::detail::ComposableParserImpl<clara::detail::Opt>::operator|
            (&local_f0,(ComposableParserImpl<clara::detail::Opt> *)&local_418,(Opt *)local_318);
  local_538._M_dataplus._M_p = (pointer)&local_538.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_538,"minutes","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<clara::detail::Opt> *)local_650,&local_698,&local_538);
  local_650._0_8_ = &PTR__Opt_00153220;
  local_5f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f0.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"-m","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f0,&local_558);
  local_578._M_dataplus._M_p = (pointer)&local_578.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_578,"--minutes","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f0,&local_578);
  local_598[0] = local_588;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_598,"Minutes to run fuzz tests","");
  std::__cxx11::string::_M_assign((string *)&local_610);
  clara::detail::Parser::operator|(&local_90,&local_f0,(Opt *)local_650);
  local_5b8._M_dataplus._M_p = (pointer)&local_5b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5b8,"hours","");
  clara::detail::ParserRefImpl<clara::detail::Opt>::ParserRefImpl<unsigned_int>
            ((ParserRefImpl<clara::detail::Opt> *)local_2a0,&local_684,&local_5b8);
  local_2a0._0_8_ = &PTR__Opt_00153220;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_240.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_338._M_dataplus._M_p = (pointer)&local_338.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_338,"-h","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_240,&local_338);
  local_5d8._M_dataplus._M_p = (pointer)&local_5d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5d8,"--hours","");
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_240,&local_5d8);
  local_358[0] = local_348;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"Hours to run fuzz tests","");
  std::__cxx11::string::_M_assign((string *)&local_260);
  clara::detail::Parser::operator|(&local_1b0,&local_90,(Opt *)local_2a0);
  clara::detail::Help::Help((Help *)local_228,&local_699);
  local_694 = argc;
  local_680 = argv;
  clara::detail::Parser::operator|(&local_150,&local_1b0,(Help *)local_228);
  local_228._0_8_ = &PTR__Opt_00153220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  local_228._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_p != &local_1d8) {
    operator_delete(local_1e8._M_p,local_1d8._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_p != &local_1f8) {
    operator_delete(local_208._M_p,local_1f8._M_allocated_capacity + 1);
  }
  if (local_210._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_210._M_pi);
  }
  local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_1b0.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector
            (&local_1b0.m_options);
  local_1b0.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_1b0.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_1b0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_1b0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_358[0] != local_348) {
    operator_delete(local_358[0],local_348[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5d8._M_dataplus._M_p != &local_5d8.field_2) {
    operator_delete(local_5d8._M_dataplus._M_p,local_5d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  local_2a0._0_8_ = &PTR__Opt_00153220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_240);
  local_2a0._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_p != &local_250) {
    operator_delete(local_260._M_p,local_250._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_p != &local_270) {
    operator_delete(local_280._M_p,local_270._M_allocated_capacity + 1);
  }
  if (local_288._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_288._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5b8._M_dataplus._M_p != &local_5b8.field_2) {
    operator_delete(local_5b8._M_dataplus._M_p,local_5b8.field_2._M_allocated_capacity + 1);
  }
  local_90.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_90.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector(&local_90.m_options)
  ;
  local_90.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_90.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_90.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_598[0] != local_588) {
    operator_delete(local_598[0],local_588[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_578._M_dataplus._M_p != &local_578.field_2) {
    operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_558._M_dataplus._M_p != &local_558.field_2) {
    operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
  }
  local_650._0_8_ = &PTR__Opt_00153220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f0);
  local_650._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_610._M_p != &local_600) {
    operator_delete(local_610._M_p,local_600._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_630._M_p != &local_620) {
    operator_delete(local_630._M_p,local_620._M_allocated_capacity + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_640._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_640._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_538._M_dataplus._M_p != &local_538.field_2) {
    operator_delete(local_538._M_dataplus._M_p,local_538.field_2._M_allocated_capacity + 1);
  }
  local_f0.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_f0.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector(&local_f0.m_options)
  ;
  local_f0.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_f0.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_f0.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_f0.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_518[0] != local_508) {
    operator_delete(local_518[0],local_508[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4f8._M_dataplus._M_p != &local_4f8.field_2) {
    operator_delete(local_4f8._M_dataplus._M_p,local_4f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4d8._M_dataplus._M_p != &local_4d8.field_2) {
    operator_delete(local_4d8._M_dataplus._M_p,local_4d8.field_2._M_allocated_capacity + 1);
  }
  local_318._0_8_ = &PTR__Opt_00153220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b8);
  local_318._0_8_ = &PTR__ParserRefImpl_00153450;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._32_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_2e8) {
    operator_delete((void *)local_318._32_8_,local_2e8._M_allocated_capacity + 1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_318._24_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_318._24_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (local_498[0] != local_488) {
    operator_delete(local_498[0],local_488[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_478._M_dataplus._M_p != &local_478.field_2) {
    operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_458._M_dataplus._M_p != &local_458.field_2) {
    operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
  }
  local_418._M_unused._M_object = &PTR__Opt_00153220;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_3b8);
  local_418._M_unused._M_object = &PTR__ParserRefImpl_00153450;
  if (_Stack_3d8._M_p != local_3d0 + 8) {
    operator_delete(_Stack_3d8._M_p,local_3d0._8_8_ + 1);
  }
  iVar13 = local_694;
  pvVar2 = (void *)CONCAT44(uStack_3f4,CONCAT22(uStack_3f6,CONCAT11(bStack_3f7,local_3f8)));
  if (pvVar2 != (void *)((long)local_3f0 + 8U)) {
    operator_delete(pvVar2,local_3f0._8_8_ + 1);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_408._8_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_438._M_dataplus._M_p != &local_438.field_2) {
    operator_delete(local_438._M_dataplus._M_p,local_438.field_2._M_allocated_capacity + 1);
  }
  clara::detail::Args::Args((Args *)&local_418,iVar13,local_680);
  clara::detail::ParserBase::parse
            ((InternalParseResult *)local_318,&local_150.super_ParserBase,(Args *)&local_418);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_3f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_418._M_unused._0_8_ != &local_408) {
    operator_delete(local_418._M_unused._M_object,(ulong)(local_408._M_allocated_capacity + 1));
  }
  if (local_318._8_4_ == Optional) {
    if (local_699 == true) {
      iVar13 = 0;
      clara::detail::Parser::writeToStream(&local_150,(ostream *)&std::cout);
    }
    else {
      if (local_684 == 0 && (local_698 == 0 && local_690 == (_func_int *)0x0)) {
        local_690 = (_func_int *)0x186a0;
      }
      else {
        if (local_684 != 0) {
          local_698 = local_684 * 0x3c + local_698;
        }
        if ((local_690 == (_func_int *)0x0) && (local_698 != 0)) {
          local_690 = (_func_int *)0xe8d4a51000;
        }
      }
      if (local_698 == 0) {
        local_698 = 60000;
      }
      lVar9 = std::chrono::_V2::system_clock::now();
      uVar14 = (ulong)local_698;
      local_408._M_allocated_capacity = 0;
      local_408._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_418._M_unused._M_object = (_func_int **)0x0;
      local_418._8_8_ = 0;
      local_3f0._0_8_ = (pointer)0x0;
      local_3f0._8_8_ = 0;
      local_3f0._16_8_ = (code *)0x0;
      _Stack_3d8._M_p = (pointer)0x0;
      local_3d0._0_8_ = (void *)0x0;
      local_3d0._8_8_ = 0;
      local_3d0._16_8_ = (code *)0x0;
      auStack_3b8._0_8_ = (pointer)0x0;
      auStack_3b8._8_8_ = (pointer)0x0;
      auStack_3b8._16_8_ = (pointer)0x0;
      local_3a0 = (_Manager_type)0x0;
      p_Stack_398 = (_Invoker_type)0x0;
      local_390 = 2000;
      local_38c = true;
      local_3f8 = false;
      uStack_3f6._0_1_ = false;
      uStack_3f6._1_1_ = true;
      bStack_3f7 = false;
      Jinx::Initialize((GlobalParams *)&local_418);
      Jinx::CreateRuntime();
      local_380 = (_func_int *)(uVar14 * 60000000000 + lVar9);
      uVar14 = 0;
      local_680 = (char **)CONCAT71(local_680._1_7_,1);
      ppcVar11 = s_testScripts;
      local_694 = 0;
      do {
        uVar5 = local_2a0._0_8_;
        pcVar1 = *ppcVar11;
        local_378[0] = local_368;
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)local_378,
                   "Test Script","");
        local_650._0_8_ = &local_640;
        std::__cxx11::basic_string<char,std::char_traits<char>,Jinx::Allocator<char>>::
        _M_construct<char_const*>
                  ((basic_string<char,std::char_traits<char>,Jinx::Allocator<char>> *)local_650,
                   "core","");
        (**(code **)*(_func_int **)uVar5)
                  (local_228,uVar5,pcVar1,local_378,
                   (basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_650,1
                  );
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
             *)local_650._0_8_ != &local_640) {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::
          _M_destroy((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_650
                     ,local_640._M_allocated_capacity);
        }
        if (local_378[0] != local_368) {
          Jinx::MemFree(local_378[0],local_368[0] + 1);
        }
        if ((_func_int **)local_228._0_8_ == (_func_int **)0x0) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Unable to compile test script #",0x1f);
          poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          local_694 = -1;
          cVar7 = '\0';
        }
        else {
          local_660 = (_func_int **)local_228._0_8_;
          local_658 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)(local_228._8_8_ + 8) = *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)(local_228._8_8_ + 8) = *(_Atomic_word *)(local_228._8_8_ + 8) + 1;
            }
          }
          local_678 = std::any::_Manager_internal<std::nullptr_t>::_S_manage;
          local_670 = 0;
          (**(code **)(*(_func_int **)local_2a0._0_8_ + 8))
                    ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_650
                     ,local_2a0._0_8_,&local_660,&local_678);
          if (local_678 != (code *)0x0) {
            (*local_678)(3,&local_678,0);
            local_678 = (code *)0x0;
          }
          if (local_658 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_658);
          }
          cVar7 = (**(code **)*(_func_int **)local_650._0_8_)();
          if (cVar7 == '\0') {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Unable to execute test script #",0x1f);
            poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
            local_694 = -1;
            std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)local_650._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_650._8_8_);
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_228._8_8_);
        }
        if (cVar7 == '\0') break;
        bVar16 = uVar14 < 0x20;
        uVar14 = uVar14 + 1;
        local_680 = (char **)CONCAT71(local_680._1_7_,bVar16);
        ppcVar11 = ppcVar11 + 1;
      } while (uVar14 != 0x21);
      iVar13 = local_694;
      if (((ulong)local_680 & 1) == 0) {
        local_650._0_8_ = local_650;
        local_640._M_allocated_capacity = 0;
        local_650._8_8_ = local_650._0_8_;
        iVar13 = std::thread::hardware_concurrency();
        if (0 < iVar13) {
          iVar15 = 0;
          do {
            uVar6 = local_2a0._8_8_;
            uVar5 = local_2a0._0_8_;
            p_Var4 = local_668;
            p_Var3 = local_690;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_2a0._8_8_ + 8) = *(_Atomic_word *)(local_2a0._8_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_2a0._8_8_ + 8) = *(_Atomic_word *)(local_2a0._8_8_ + 8) + 1;
              }
            }
            local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
            local_228._0_8_ = operator_new(0x40);
            *(undefined ***)local_228._0_8_ = &PTR___State_impl_00153138;
            *(int *)(local_228._0_8_ + 8) = iVar15;
            *(_func_int **)(local_228._0_8_ + 0x10) = p_Var4;
            *(int *)(local_228._0_8_ + 0x18) = iVar13;
            *(_func_int **)(local_228._0_8_ + 0x20) = p_Var3;
            *(undefined8 *)(local_228._0_8_ + 0x28) = uVar5;
            *(undefined8 *)(local_228._0_8_ + 0x30) = uVar6;
            *(_func_int **)(local_228._0_8_ + 0x38) = local_380;
            std::thread::_M_start_thread(&local_1b0,local_228,0);
            if ((_func_int **)local_228._0_8_ != (_func_int **)0x0) {
              (**(code **)(*(_func_int **)local_228._0_8_ + 8))();
            }
            p_Var10 = (_List_node_base *)operator_new(0x18);
            p_Var10[1]._M_next = (_List_node_base *)0x0;
            p_Var10[1]._M_next = (_List_node_base *)local_1b0.super_ParserBase._vptr_ParserBase;
            local_1b0.super_ParserBase._vptr_ParserBase = (_func_int **)0x0;
            std::__detail::_List_node_base::_M_hook(p_Var10);
            local_640._M_allocated_capacity = (size_type)(local_640._M_allocated_capacity + 1);
            if (local_1b0.super_ParserBase._vptr_ParserBase != (_func_int **)0x0) {
              std::terminate();
            }
            iVar15 = iVar15 + 1;
          } while (iVar13 != iVar15);
        }
        plVar12 = (long *)local_650;
        while (plVar12 = (long *)*plVar12, plVar12 != (long *)local_650) {
          std::thread::join();
        }
        std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
                  ((_List_base<std::thread,_std::allocator<std::thread>_> *)local_650);
        local_640._M_allocated_capacity = 0;
        local_650._0_8_ = local_650;
        local_650._8_8_ = local_650;
        std::__cxx11::_List_base<std::thread,_std::allocator<std::thread>_>::_M_clear
                  ((_List_base<std::thread,_std::allocator<std::thread>_> *)local_650);
        iVar13 = 0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a0._8_8_);
      }
      if (local_3a0 != (_Manager_type)0x0) {
        (*local_3a0)((_Any_data *)(auStack_3b8 + 8),(_Any_data *)(auStack_3b8 + 8),__destroy_functor
                    );
      }
      if ((code *)local_3d0._16_8_ != (code *)0x0) {
        (*(code *)local_3d0._16_8_)(local_3d0,local_3d0,3);
      }
      if ((code *)local_3f0._16_8_ != (code *)0x0) {
        (*(code *)local_3f0._16_8_)(local_3f0,local_3f0,3);
      }
      if ((element_type *)local_408._M_allocated_capacity != (element_type *)0x0) {
        (*(code *)local_408._M_allocated_capacity)(&local_418,&local_418,3);
      }
    }
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error in command line: ",0x17);
    local_418._M_unused._M_object = &local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,local_2d8._M_p,local_2d8._M_p + local_2d0);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(char *)local_418._M_unused._0_8_,local_418._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_unused._0_8_ != &local_408) {
      operator_delete(local_418._M_unused._M_object,(ulong)(local_408._M_allocated_capacity + 1));
    }
    iVar13 = -1;
  }
  local_318._0_8_ = &PTR__BasicResult_001534e0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2d8._M_p != &local_2c8) {
    operator_delete(local_2d8._M_p,local_2c8._M_allocated_capacity + 1);
  }
  local_318._0_8_ = &PTR__ResultValueBase_00153538;
  if (local_318._8_4_ == Optional) {
    std::vector<clara::detail::Token,_std::allocator<clara::detail::Token>_>::~vector
              ((vector<clara::detail::Token,_std::allocator<clara::detail::Token>_> *)
               (local_318 + 0x28));
  }
  local_150.super_ParserBase._vptr_ParserBase = (_func_int **)&PTR__Parser_00153560;
  std::vector<clara::detail::Arg,_std::allocator<clara::detail::Arg>_>::~vector(&local_150.m_args);
  std::vector<clara::detail::Opt,_std::allocator<clara::detail::Opt>_>::~vector
            (&local_150.m_options);
  local_150.m_exeName.super_ComposableParserImpl<clara::detail::ExeName>.super_ParserBase.
  _vptr_ParserBase = (ParserBase)&PTR__ExeName_001535b0;
  if (local_150.m_exeName.m_ref.
      super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_ref.
               super___shared_ptr<clara::detail::BoundValueRefBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_150.m_exeName.m_name.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_150.m_exeName.m_name.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return iVar13;
}

Assistant:

int main(int argc, char * argv[])
{
	// Handle command-line options
	uint64_t permutations = 0;
	uint64_t start = 0;
	uint32_t minutes = 0;
	uint32_t hours = 0;
	bool showHelp = false;
	auto parser =
		Opt(permutations, "permutations")["-p"]["--permutations"]("Max number of permutations to run") |
		Opt(start, "start")["-s"]["--start"]("Starting permutation") |
		Opt(minutes, "minutes")["-m"]["--minutes"]("Minutes to run fuzz tests") |
		Opt(hours, "hours")["-h"]["--hours"]("Hours to run fuzz tests") |
		Help(showHelp);

	auto result = parser.parse(Args(argc, argv));
	if (!result)
	{
		std::cerr << "Error in command line: " << result.errorMessage() << "\n";
		return -1;
	}
	else if (showHelp)
	{
		parser.writeToStream(std::cout);
		return 0;
	}

	// Set max permutations and/or time to run
	if (!permutations && !minutes && !hours)
	{
		// Pick a default number of permutations to run if no arguments are passed
		permutations = 100'000;

	}
	else
	{
		// Convert hours to minutes
		if (hours)
			minutes += (hours * 60);

		if (minutes)
		{
			// If permutation limit hasn't been specified
			if (!permutations)
				permutations = 1'000'000'000'000;
		}
	}

	if (!minutes)
	{
		// If time isn't specified, set max time to 1000 hours
		minutes = 60 * 1000;
	}

	// Start timer
	const auto startTime = std::chrono::system_clock::now();
	const auto stopTime = startTime + std::chrono::minutes(minutes);

	// Initialize Jinx and
	Jinx::GlobalParams globalParams;
	globalParams.logSymbols = false;
	globalParams.logBytecode = false;
	globalParams.enableLogging = false;
	Jinx::Initialize(globalParams);
	auto runtime = CreateRuntime();

	// Validate that all scripts compile and execute successfully
	for (auto i = 0u; i < std::size(s_testScripts); ++i)
	{
		// Compile the text to bytecode
		auto bytecode = runtime->Compile(s_testScripts[i], "Test Script", { "core" });
		if (!bytecode)
		{
			std::cerr << "Unable to compile test script #" << i << "\n";
			return -1;
		}

		// Create a runtime script with the given bytecode
		auto script = runtime->CreateScript(bytecode);
		
		if (!script->Execute())
		{
			std::cerr << "Unable to execute test script #" << i << "\n";
			return -1;
		}
	}

	std::list<std::thread> threadList;
	int numCores = std::thread::hardware_concurrency();
	for (int n = 0; n < numCores; ++n)
	{
		threadList.push_back(std::thread([n, start, numCores, permutations, runtime, stopTime]()
		{
			Fuzzer sourceFuzzer;
			for (uint64_t j = n; j < permutations; j += numCores)
			{
				if (std::chrono::system_clock::now() > stopTime)
					break;
				for (int i = 0; i < static_cast<int>(std::size(s_testScripts)); ++i)
				{
					// Compile the text to bytecode
					auto bytecode = runtime->Compile(sourceFuzzer.Fuzz(s_testScripts[i], j + start), "Test Script");
					if (!bytecode)
						continue;

					// Create and execute the script if viable
					auto script = runtime->CreateScript(bytecode);
					if (!script)
						continue;
					do
					{
						if (!script->Execute())
							break;
					}
					while (!script->IsFinished());
				}
				auto stats = Jinx::GetMemoryStats();
				printf("Permutation %" PRIu64 " (Allocated Memory = %" PRIu64 " KB)\n", j + start, stats.allocatedMemory / 1024);
			}
		}));
	}

	// Wait for all threads to finish
	for (auto & t : threadList)
		t.join();
	threadList.clear();

	return 0;
}